

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

int pfx_record_cmp(void *data1,void *data2)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  pfx_record *arg2;
  pfx_record *arg1;
  void *data2_local;
  void *data1_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((*data1 == *data2) && (*(char *)((long)data1 + 0x19) == *(char *)((long)data2 + 0x19))) &&
      (*(char *)((long)data1 + 0x18) == *(char *)((long)data2 + 0x18))) &&
     (uVar2 = lrtr_ip_addr_equal(), (uVar2 & 1) != 0)) {
    data1_local._4_4_ = 0;
  }
  else {
    data1_local._4_4_ = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return data1_local._4_4_;
}

Assistant:

static int pfx_record_cmp(const void *data1, const void *data2)
{
	const struct pfx_record *arg1 = data1;
	const struct pfx_record *arg2 = data2;

	if ((arg1->asn == arg2->asn) && (arg1->max_len == arg2->max_len) && (arg1->min_len == arg2->min_len) &&
	    lrtr_ip_addr_equal(arg1->prefix, arg2->prefix))
		return 0;

	return 1;
}